

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsSecondDerivByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,double *outSumLogLikelihoodByPartition,
          double *outSumFirstDerivativeByPartition,double *outSumSecondDerivativeByPartition)

{
  int iVar1;
  int iVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long in_stack_00000008;
  int i_3;
  int k_3;
  float *scalingFactors;
  long in_stack_00000020;
  int i_2;
  float sumOverID2;
  float sumOverID1;
  float sumOverI;
  int k_2;
  int u;
  int j;
  double sumOverJD2;
  double sumOverJD1;
  double sumOverJ;
  int i_1;
  int w_1;
  int k_1;
  float weight_1;
  int u_2;
  int l_1;
  int v_1;
  float *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  float weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  float *freqs;
  float *wt;
  float *secondDerivMatrix;
  float *firstDerivMatrix;
  float *transMatrix;
  float *partialsParent;
  int scalingFactorsIndex;
  int stateFrequenciesIndex;
  int categoryWeightsIndex;
  int secondDerivativeIndex;
  int firstDerivativeIndex;
  int probIndex;
  int childIndex;
  int parIndex;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  int local_128;
  int local_124;
  int local_114;
  float local_110;
  float local_10c;
  float local_108;
  int local_104;
  int local_100;
  int local_fc;
  double local_f8;
  double local_f0;
  double local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_b8;
  int local_b4;
  int local_ac;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_34;
  
  for (local_34 = 0; local_34 < (int)sumOverID2; local_34 = local_34 + 1) {
    iVar1 = *(int *)(in_stack_00000020 + (long)local_34 * 4);
    local_128 = *(int *)(*(long *)(in_RDI + 0x88) + (long)iVar1 * 4);
    iVar1 = *(int *)(*(long *)(in_RDI + 0x88) + (long)(iVar1 + 1) * 4);
    memset((void *)(*(long *)(in_RDI + 0xd8) + (long)(local_128 * *(int *)(in_RDI + 0x24)) * 4),0,
           (long)((iVar1 - local_128) * *(int *)(in_RDI + 0x24)) << 2);
    memset((void *)(*(long *)(in_RDI + 0xe0) + (long)(local_128 * *(int *)(in_RDI + 0x24)) * 4),0,
           (long)((iVar1 - local_128) * *(int *)(in_RDI + 0x24)) << 2);
    memset((void *)(*(long *)(in_RDI + 0xe8) + (long)(local_128 * *(int *)(in_RDI + 0x24)) * 4),0,
           (long)((iVar1 - local_128) * *(int *)(in_RDI + 0x24)) << 2);
    iVar2 = *(int *)(in_RDX + (long)local_34 * 4);
    fVar3 = scalingFactors[local_34];
    lVar4 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)(in_RSI + (long)local_34 * 4) * 8);
    lVar5 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)*(int *)(in_RCX + (long)local_34 * 4) * 8);
    lVar6 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)*(int *)(in_R8 + (long)local_34 * 4) * 8);
    lVar7 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)*(int *)(in_R9 + (long)local_34 * 4) * 8);
    lVar8 = *(long *)(*(long *)(in_RDI + 0x98) +
                     (long)*(int *)(in_stack_00000008 + (long)local_34 * 4) * 8);
    lVar9 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(_i_3 + (long)local_34 * 4) * 8);
    if ((iVar2 < *(int *)(in_RDI + 0x10)) &&
       (*(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar2 * 8) != 0)) {
      lVar10 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar2 * 8);
      local_9c = local_128 * *(int *)(in_RDI + 0x2c);
      for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0x34); local_a0 = local_a0 + 1) {
        local_a4 = local_128 * *(int *)(in_RDI + 0x24);
        uVar13 = *(uint *)(lVar8 + (long)local_a0 * 4);
        for (local_ac = local_128; local_ac < iVar1; local_ac = local_ac + 1) {
          iVar2 = *(int *)(lVar10 + (long)local_ac * 4);
          local_b4 = local_a0 * *(int *)(in_RDI + 0x40);
          for (local_b8 = 0; local_b8 < *(int *)(in_RDI + 0x24); local_b8 = local_b8 + 1) {
            auVar15 = vfmadd213ss_fma(ZEXT416(uVar13),
                                      ZEXT416((uint)(*(float *)(lVar5 + (long)(local_b4 + iVar2) * 4
                                                               ) *
                                                    *(float *)(lVar4 + (long)(local_9c + local_b8) *
                                                                       4))),
                                      ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) +
                                                       (long)local_a4 * 4)));
            *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_a4 * 4) = auVar15._0_4_;
            auVar15 = vfmadd213ss_fma(ZEXT416(uVar13),
                                      ZEXT416((uint)(*(float *)(lVar6 + (long)(local_b4 + iVar2) * 4
                                                               ) *
                                                    *(float *)(lVar4 + (long)(local_9c + local_b8) *
                                                                       4))),
                                      ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe0) +
                                                       (long)local_a4 * 4)));
            *(int *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 4) = auVar15._0_4_;
            fVar11 = *(float *)(lVar7 + (long)(local_b4 + iVar2) * 4) *
                     *(float *)(lVar4 + (long)(local_9c + local_b8) * 4);
            in_ZMM1 = ZEXT464((uint)fVar11);
            auVar15 = vfmadd213ss_fma(ZEXT416(uVar13),ZEXT416((uint)fVar11),
                                      ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe8) +
                                                       (long)local_a4 * 4)));
            *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_a4 * 4) = auVar15._0_4_;
            local_a4 = local_a4 + 1;
            local_b4 = *(int *)(in_RDI + 0x28) + local_b4;
          }
          local_9c = *(int *)(in_RDI + 0x2c) + local_9c;
        }
        local_9c = ((*(int *)(in_RDI + 0x14) - iVar1) + local_128) * *(int *)(in_RDI + 0x2c) +
                   local_9c;
      }
    }
    else {
      lVar10 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)iVar2 * 8);
      local_c4 = local_128 * *(int *)(in_RDI + 0x2c);
      for (local_c8 = 0; local_c8 < *(int *)(in_RDI + 0x34); local_c8 = local_c8 + 1) {
        local_cc = local_128 * *(int *)(in_RDI + 0x24);
        fVar11 = *(float *)(lVar8 + (long)local_c8 * 4);
        for (local_d4 = local_128; local_d4 < iVar1; local_d4 = local_d4 + 1) {
          local_d8 = local_c8 * *(int *)(in_RDI + 0x40);
          for (local_dc = 0; local_dc < *(int *)(in_RDI + 0x24); local_dc = local_dc + 1) {
            local_e8 = 0.0;
            local_f0 = 0.0;
            local_f8 = 0.0;
            for (local_fc = 0; local_fc < *(int *)(in_RDI + 0x24); local_fc = local_fc + 1) {
              local_e8 = (double)(*(float *)(lVar5 + (long)local_d8 * 4) *
                                 *(float *)(lVar10 + (long)(local_c4 + local_fc) * 4)) + local_e8;
              local_f0 = (double)(*(float *)(lVar6 + (long)local_d8 * 4) *
                                 *(float *)(lVar10 + (long)(local_c4 + local_fc) * 4)) + local_f0;
              fVar12 = *(float *)(lVar7 + (long)local_d8 * 4) *
                       *(float *)(lVar10 + (long)(local_c4 + local_fc) * 4);
              in_ZMM1 = ZEXT464((uint)fVar12);
              local_f8 = (double)fVar12 + local_f8;
              local_d8 = local_d8 + 1;
            }
            local_d8 = local_d8 + 1;
            auVar22._8_8_ = in_ZMM1._8_8_;
            auVar22._0_8_ = (double)fVar11;
            auVar28._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0xd8) + (long)local_cc * 4);
            auVar28._8_8_ = 0;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = local_e8 * (double)*(float *)(lVar4 + (long)(local_c4 + local_dc) * 4);
            auVar15 = vfmadd213sd_fma(auVar22,auVar15,auVar28);
            *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_cc * 4) = (float)auVar15._0_8_;
            auVar23._0_8_ = (double)fVar11;
            auVar23._8_8_ = auVar15._8_8_;
            auVar29._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0xe0) + (long)local_cc * 4);
            auVar29._8_8_ = 0;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = local_f0 * (double)*(float *)(lVar4 + (long)(local_c4 + local_dc) * 4);
            auVar15 = vfmadd213sd_fma(auVar23,auVar16,auVar29);
            *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_cc * 4) = (float)auVar15._0_8_;
            auVar24._0_8_ = (double)fVar11;
            auVar24._8_8_ = auVar15._8_8_;
            auVar30._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0xe8) + (long)local_cc * 4);
            auVar30._8_8_ = 0;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = local_f8 * (double)*(float *)(lVar4 + (long)(local_c4 + local_dc) * 4);
            auVar15 = vfmadd213sd_fma(auVar24,auVar17,auVar30);
            in_ZMM1 = ZEXT1664(auVar15);
            *(float *)(*(long *)(in_RDI + 0xe8) + (long)local_cc * 4) = (float)auVar15._0_8_;
            local_cc = local_cc + 1;
          }
          local_c4 = *(int *)(in_RDI + 0x2c) + local_c4;
        }
        local_c4 = ((*(int *)(in_RDI + 0x14) - iVar1) + local_128) * *(int *)(in_RDI + 0x2c) +
                   local_c4;
      }
    }
    local_100 = local_128 * *(int *)(in_RDI + 0x24);
    for (local_104 = local_128; local_104 < iVar1; local_104 = local_104 + 1) {
      local_108 = 0.0;
      local_10c = 0.0;
      local_110 = 0.0;
      for (local_114 = 0; local_114 < *(int *)(in_RDI + 0x24); local_114 = local_114 + 1) {
        auVar15 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_100 * 4))
                                  ,ZEXT416(*(uint *)(lVar9 + (long)local_114 * 4)),
                                  ZEXT416((uint)local_108));
        local_108 = auVar15._0_4_;
        auVar15 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe0) + (long)local_100 * 4))
                                  ,ZEXT416(*(uint *)(lVar9 + (long)local_114 * 4)),
                                  ZEXT416((uint)local_10c));
        local_10c = auVar15._0_4_;
        auVar15 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe8) + (long)local_100 * 4))
                                  ,ZEXT416(*(uint *)(lVar9 + (long)local_114 * 4)),
                                  ZEXT416((uint)local_110));
        local_110 = auVar15._0_4_;
        local_100 = local_100 + 1;
      }
      dVar14 = log((double)local_108);
      *(float *)(*(long *)(in_RDI + 0x108) + (long)local_104 * 4) = (float)dVar14;
      *(float *)(*(long *)(in_RDI + 0x110) + (long)local_104 * 4) = local_10c / local_108;
      uVar13 = *(uint *)(*(long *)(in_RDI + 0x110) + (long)local_104 * 4) ^ 0x80000000;
      in_ZMM1 = ZEXT464(uVar13);
      auVar15 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x110) + (long)local_104 * 4)),
                                ZEXT416(uVar13),ZEXT416((uint)(local_110 / local_108)));
      *(int *)(*(long *)(in_RDI + 0x118) + (long)local_104 * 4) = auVar15._0_4_;
    }
    if (fVar3 != -NAN) {
      lVar4 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)(int)fVar3 * 8);
      for (local_124 = local_128; local_124 < iVar1; local_124 = local_124 + 1) {
        *(float *)(*(long *)(in_RDI + 0x108) + (long)local_124 * 4) =
             *(float *)(lVar4 + (long)local_124 * 4) +
             *(float *)(*(long *)(in_RDI + 0x108) + (long)local_124 * 4);
      }
    }
    *(undefined8 *)(_sumOverI + (long)local_34 * 8) = 0;
    *(undefined8 *)(_u + (long)local_34 * 8) = 0;
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    *(undefined8 *)((long)sumOverJD2 + (long)local_34 * 8) = 0;
    for (; local_128 < iVar1; local_128 = local_128 + 1) {
      auVar25._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x108) + (long)local_128 * 4);
      auVar25._8_8_ = auVar21._8_8_;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_128 * 8);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(_sumOverI + (long)local_34 * 8);
      auVar15 = vfmadd213sd_fma(auVar18,auVar25,auVar31);
      *(long *)(_sumOverI + (long)local_34 * 8) = auVar15._0_8_;
      auVar26._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x110) + (long)local_128 * 4);
      auVar26._8_8_ = auVar15._8_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_128 * 8);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(_u + (long)local_34 * 8);
      auVar15 = vfmadd213sd_fma(auVar19,auVar26,auVar32);
      *(long *)(_u + (long)local_34 * 8) = auVar15._0_8_;
      auVar27._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x118) + (long)local_128 * 4);
      auVar27._8_8_ = auVar15._8_8_;
      in_ZMM1 = ZEXT1664(auVar27);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_128 * 8);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)((long)sumOverJD2 + (long)local_34 * 8);
      auVar15 = vfmadd213sd_fma(auVar20,auVar27,auVar33);
      auVar21 = ZEXT1664(auVar15);
      *(long *)((long)sumOverJD2 + (long)local_34 * 8) = auVar15._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* firstDerivativeIndices,
                                                  const int* secondDerivativeIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition,
                                                  double* outSumFirstDerivativeByPartition,
                                                  double* outSumSecondDerivativeByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&firstDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&secondDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int firstDerivativeIndex = firstDerivativeIndices[p];
        const int secondDerivativeIndex = secondDerivativeIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
        const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child

            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJ = 0.0;
                        double sumOverJD1 = 0.0;
                        double sumOverJD2 = 0.0;
                        for(int j = 0; j < kStateCount; j++) {
                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                            sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                            sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                            w++;
                        }

                        // increment for the extra column at the end
                        w += T_PAD;

                        integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                        u++;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            REALTYPE sumOverID1 = 0.0;
            REALTYPE sumOverID2 = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                sumOverID1 += freqs[i] * firstDerivTmp[u];
                sumOverID2 += freqs[i] * secondDerivTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
            outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
            outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }


        outSumLogLikelihoodByPartition[p] = 0.0;
        outSumFirstDerivativeByPartition[p] = 0.0;
        outSumSecondDerivativeByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p]    += outLogLikelihoodsTmp[i]    * gPatternWeights[i];
            outSumFirstDerivativeByPartition[p]  += outFirstDerivativesTmp[i]  * gPatternWeights[i];
            outSumSecondDerivativeByPartition[p] += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }

    }
}